

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int lyd_list_equal(lyd_node *first,lyd_node *second,int action,int withdefaults,int log)

{
  LYS_NODE LVar1;
  lys_node *plVar2;
  char *__s1;
  int iVar3;
  int iVar4;
  char *__string;
  LY_ERR *pLVar5;
  lyd_node *plVar6;
  lyd_node *plVar7;
  lyd_node *plVar8;
  char *path;
  char *path_00;
  uint8_t *puVar9;
  lys_ext_instance **pplVar10;
  size_t sVar11;
  lys_node *last;
  lys_node *plVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  lyd_node **pplVar16;
  ulong uVar17;
  lys_ext *__s;
  uint8_t *__s_00;
  char *local_80;
  uint16_t local_46;
  int local_44;
  uint16_t idx1;
  lyd_node *plStack_40;
  uint16_t local_32 [4];
  uint16_t idx2;
  
  __string = ly_buf();
  if (first != (lyd_node *)0x0) {
    plVar2 = first->schema;
    LVar1 = plVar2->nodetype;
    if ((LVar1 & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
      if (second != (lyd_node *)0x0) {
        plVar12 = second->schema;
        if ((plVar12->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
          if (LVar1 != plVar12->nodetype) {
            __assert_fail("first->schema->nodetype == second->schema->nodetype",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                          ,0x143e,
                          "int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)")
            ;
          }
          if (plVar2 == plVar12) {
            if (LVar1 == LYS_LIST) {
              if (action != 0) {
                uVar14 = 0;
                plStack_40 = second;
                if (action < 1) goto LAB_0015c787;
                if ((uint)plVar2->padding[3] < (uint)action) goto LAB_0015c787;
                uVar14 = (ulong)(action - 1);
                do {
                  for (uVar17 = 0; uVar17 < *(byte *)(plVar2[1].ext + uVar14 * 2 + 1);
                      uVar17 = uVar17 + 1) {
                    plVar6 = resolve_data_descendant_schema_nodeid
                                       ((char *)(&plVar2[1].ext[uVar14 * 2]->def)[uVar17],
                                        first->child);
                    if (plVar6 == (lyd_node *)0x0) {
                      plVar6 = (lyd_node *)
                               lyd_get_unique_default
                                         ((char *)(&plVar2[1].ext[uVar14 * 2]->def)[uVar17],first);
                      pLVar5 = ly_errno_location();
                      if (*pLVar5 != LY_SUCCESS) {
                        return -1;
                      }
                    }
                    else {
                      plVar6 = plVar6->child;
                    }
                    plVar8 = plStack_40;
                    plVar7 = resolve_data_descendant_schema_nodeid
                                       ((char *)(&plVar2[1].ext[uVar14 * 2]->def)[uVar17],
                                        plStack_40->child);
                    if (plVar7 == (lyd_node *)0x0) {
                      plVar8 = (lyd_node *)
                               lyd_get_unique_default
                                         ((char *)(&plVar2[1].ext[uVar14 * 2]->def)[uVar17],plVar8);
                      pLVar5 = ly_errno_location();
                      if (*pLVar5 != LY_SUCCESS) {
                        return -1;
                      }
                    }
                    else {
                      plVar8 = plVar7->child;
                    }
                    if (((plVar6 == (lyd_node *)0x0) || (plVar8 == (lyd_node *)0x0)) ||
                       (plVar6 != plVar8)) break;
                  }
                  if ((uVar17 != 0) && (*(byte *)(plVar2[1].ext + uVar14 * 2 + 1) == uVar17)) {
                    if (log == 0) {
                      return 1;
                    }
                    path = (char *)malloc(0x400);
                    path_00 = (char *)malloc(0x400);
                    if (path == (char *)0x0 || path_00 == (char *)0x0) {
                      pLVar5 = ly_errno_location();
                      *pLVar5 = LY_EMEM;
                      ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_list_equal");
                      free(path);
                      free(path_00);
                      return -1;
                    }
                    local_32[0] = 0x3ff;
                    local_46 = 0x3ff;
                    path[0x3ff] = '\0';
                    path_00[0x3ff] = '\0';
                    ly_vlog_build_path_reverse(LY_VLOG_LYD,first,path,&local_46,0);
                    ly_vlog_build_path_reverse(LY_VLOG_LYD,plStack_40,path_00,local_32,0);
                    puVar9 = ly_buf_used_location();
                    if ((*puVar9 == '\0') || (*__string == '\0')) {
                      local_80 = (char *)0x0;
                    }
                    else {
                      local_80 = strndup(__string,0x3ff);
                    }
                    plVar6 = plStack_40;
                    puVar9 = ly_buf_used_location();
                    *puVar9 = *puVar9 + '\x01';
                    uVar17 = 0;
                    uVar15 = 0;
                    do {
                      pplVar10 = plVar2[1].ext;
                      if (*(byte *)(pplVar10 + uVar14 * 2 + 1) <= uVar17) {
                        ly_vlog(LYE_NOUNIQ,LY_VLOG_LYD,plVar6,__string,path + local_46,
                                path_00 + local_32[0]);
                        free(path);
                        free(path_00);
                        if (local_80 != (char *)0x0) {
                          strcpy(__string,local_80);
                          free(local_80);
                        }
                        puVar9 = ly_buf_used_location();
                        *puVar9 = *puVar9 + 0xff;
                        return 1;
                      }
                      if (uVar17 != 0) {
                        __string[uVar15 & 0xffff] = ' ';
                        pplVar10 = plVar2[1].ext;
                        uVar15 = (ulong)((int)uVar15 + 1);
                      }
                      __s = (&pplVar10[uVar14 * 2]->def)[uVar17];
                      local_44 = 0;
                      plVar12 = first->schema;
                      do {
                        puVar9 = (uint8_t *)strchr((char *)__s,0x2f);
                        if (puVar9 == (uint8_t *)0x0) {
                          sVar11 = strlen((char *)__s);
                          puVar9 = __s->padding + (sVar11 - 0x1b);
                        }
                        last = (lys_node *)0x0;
                        do {
                          last = lys_getnext(last,plVar12,(lys_module *)0x0,3);
                          if (last == (lys_node *)0x0) {
                            pLVar5 = ly_errno_location();
                            *pLVar5 = LY_EINT;
                            ly_log(LY_LLERR,"Internal error (%s:%d).",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                                   ,0x1419);
                            plVar6 = plStack_40;
                            iVar4 = 0xffff;
                            goto LAB_0015cbde;
                          }
                          __s1 = last->name;
                          iVar3 = strncmp(__s1,(char *)__s,(long)puVar9 - (long)__s);
                          iVar4 = local_44;
                        } while ((iVar3 != 0) || (__s1[(long)puVar9 - (long)__s] != '\0'));
                        if (last->nodetype == LYS_LIST) {
                          __assert_fail("snode->nodetype != LYS_LIST",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                                        ,0x1408,
                                        "int lyd_build_relative_data_path(const struct lyd_node *, const char *, char *)"
                                       );
                        }
                        if ((last->nodetype & (LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) {
                          pcVar13 = "/";
                          if (local_44 == 0) {
                            pcVar13 = "";
                          }
                          local_44 = sprintf(__string + (long)local_44 + (uVar15 & 0xffff),"%s%s",
                                             pcVar13,__s1);
                          local_44 = local_44 + iVar4;
                        }
                        plVar6 = plStack_40;
                        plVar12 = lys_parent(last);
                        if (((plVar12 != (lys_node *)0x0) &&
                            (plVar12 = lys_parent(last), plVar12->nodetype == LYS_CHOICE)) &&
                           (last->nodetype != LYS_CASE)) {
                          __s_00 = puVar9 + 1;
                          puVar9 = (uint8_t *)strchr((char *)__s_00,0x2f);
                          if (puVar9 == (uint8_t *)0x0) {
                            sVar11 = strlen((char *)__s_00);
                            puVar9 = __s_00 + sVar11;
                          }
                        }
                        __s = (lys_ext *)(puVar9 + 1);
                        plVar12 = last;
                        iVar4 = local_44;
                      } while (*puVar9 != '\0');
LAB_0015cbde:
                      uVar15 = (ulong)(uint)((int)uVar15 + iVar4);
                      uVar17 = uVar17 + 1;
                    } while( true );
                  }
                  if (0 < action) {
                    return 0;
                  }
                  uVar14 = (ulong)((int)uVar14 + 1);
LAB_0015c787:
                  second = plStack_40;
                } while ((int)uVar14 < (int)(uint)plVar2->padding[3]);
              }
              if ((ulong)plVar2->padding[2] == 0) {
                return 0;
              }
              uVar14 = 0;
LAB_0015c8be:
              if (uVar14 == plVar2->padding[2]) {
                if (log == 0) {
                  return 1;
                }
                ly_vlog(LYE_DUPLIST,LY_VLOG_LYD,second,second->schema->name);
                return 1;
              }
              plVar12 = *(lys_node **)(*(long *)&plVar2[1].flags + uVar14 * 8);
              pplVar16 = &first->child;
              while (plVar6 = *pplVar16, pplVar16 = &second->child, plVar6 != (lyd_node *)0x0) {
                if (plVar6->schema == plVar12) {
                  plVar6 = plVar6->child;
                  goto LAB_0015c8e9;
                }
                pplVar16 = &plVar6->next;
              }
              plVar6 = (lyd_node *)0x0;
LAB_0015c8e9:
              do {
                plVar8 = *pplVar16;
                if (plVar8 == (lyd_node *)0x0) goto LAB_0015c8fc;
                if (plVar8->schema == plVar12) {
                  plVar8 = plVar8->child;
                  goto LAB_0015c904;
                }
                pplVar16 = &plVar8->next;
              } while( true );
            }
            if (LVar1 != LYS_LEAFLIST) {
              pLVar5 = ly_errno_location();
              *pLVar5 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                     ,0x14d3);
              return -1;
            }
            if ((((plVar2->flags & 2) == 0) || ((plVar2->module->field_0x40 & 0xc) == 0)) &&
               (first->child == second->child)) {
              if ((withdefaults != 0) && (((second->field_0x9 ^ first->field_0x9) & 1) != 0)) {
                return 0;
              }
              if (log != 0) {
                ly_vlog(LYE_DUPLEAFLIST,LY_VLOG_LYD,second,plVar12->name);
              }
              return 1;
            }
          }
          return 0;
        }
      }
      __assert_fail("second && (second->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x143d,
                    "int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)");
    }
  }
  __assert_fail("first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                ,0x143c,"int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)");
LAB_0015c8fc:
  plVar8 = (lyd_node *)0x0;
LAB_0015c904:
  uVar14 = uVar14 + 1;
  if (plVar6 != plVar8) {
    return 0;
  }
  goto LAB_0015c8be;
}

Assistant:

int
lyd_list_equal(struct lyd_node *first, struct lyd_node *second, int action, int withdefaults, int log)
{
    struct lys_node_list *slist;
    const struct lys_node *snode = NULL;
    struct lyd_node *diter;
    const char *val1, *val2;
    char *path1, *path2, *uniq_str = ly_buf(), *buf_backup = NULL;
    uint16_t idx1, idx2, idx_uniq;
    int i, j;

    assert(first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(second && (second->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(first->schema->nodetype == second->schema->nodetype);

    if (first->schema != second->schema) {
        return 0;
    }

    switch (first->schema->nodetype) {
    case LYS_LEAFLIST:
        if ((first->schema->flags & LYS_CONFIG_R) && first->schema->module->version >= 2) {
            /* same values are allowed for status data */
            return 0;
        }
        /* compare values */
        if (ly_strequal(((struct lyd_node_leaf_list *)first)->value_str,
                        ((struct lyd_node_leaf_list *)second)->value_str, 1)
                && (!withdefaults || (first->dflt == second->dflt))) {
            if (log) {
                LOGVAL(LYE_DUPLEAFLIST, LY_VLOG_LYD, second, second->schema->name,
                       ((struct lyd_node_leaf_list *)second)->value_str);
            }
            return 1;
        }
        return 0;
    case LYS_LIST:
        slist = (struct lys_node_list *)first->schema;

        /* compare unique leafs */
        if (action) {
            if (action > 0) {
                i = action - 1;
                if (i < slist->unique_size) {
                    goto uniquecheck;
                }
            }
            for (i = 0; i < slist->unique_size; i++) {
uniquecheck:
                for (j = 0; j < slist->unique[i].expr_size; j++) {
                    /* first */
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], first->child);
                    if (diter) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        val1 = lyd_get_unique_default(slist->unique[i].expr[j], first);
                        if (ly_errno) {
                            return -1;
                        }
                    }

                    /* second */
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], second->child);
                    if (diter) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        val2 = lyd_get_unique_default(slist->unique[i].expr[j], second);
                        if (ly_errno) {
                            return -1;
                        }
                    }

                    if (!val1 || !val2 || !ly_strequal(val1, val2, 1)) {
                        /* values differ */
                        break;
                    }
                }
                if (j && (j == slist->unique[i].expr_size)) {
                    /* all unique leafs are the same in this set, create this nice error */
                    if (!log) {
                        return 1;
                    }

                    path1 = malloc(LY_BUF_SIZE);
                    path2 = malloc(LY_BUF_SIZE);
                    if (!path1 || !path2) {
                        LOGMEM;
                        free(path1);
                        free(path2);
                        return -1;
                    }
                    idx1 = idx2 = LY_BUF_SIZE - 1;
                    path1[idx1] = '\0';
                    path2[idx2] = '\0';
                    ly_vlog_build_path_reverse(LY_VLOG_LYD, first, path1, &idx1, 0);
                    ly_vlog_build_path_reverse(LY_VLOG_LYD, second, path2, &idx2, 0);

                    /* use internal buffer to rebuild the unique string */
                    if (ly_buf_used && uniq_str[0]) {
                        buf_backup = strndup(uniq_str, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;
                    idx_uniq = 0;

                    for (j = 0; j < slist->unique[i].expr_size; ++j) {
                        if (j) {
                            uniq_str[idx_uniq++] = ' ';
                        }
                        idx_uniq += lyd_build_relative_data_path(first, slist->unique[i].expr[j], &uniq_str[idx_uniq]);
                    }

                    LOGVAL(LYE_NOUNIQ, LY_VLOG_LYD, second, uniq_str, &path1[idx1], &path2[idx2]);
                    free(path1);
                    free(path2);
                    if (buf_backup) {
                        strcpy(uniq_str, buf_backup);
                        free(buf_backup);
                    }
                    ly_buf_used--;
                    return 1;
                }

                if (action > 0) {
                    /* done */
                    return 0;
                }
            }
        }

        /* compare keys */
        if (!slist->keys_size) {
            /* status lists without keys */
            return 0;
        } else {
            for (i = 0; i < slist->keys_size; i++) {
                snode = (struct lys_node *)slist->keys[i];
                val1 = val2 = NULL;
                LY_TREE_FOR(first->child, diter) {
                    if (diter->schema == snode) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                LY_TREE_FOR(second->child, diter) {
                    if (diter->schema == snode) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                if (!ly_strequal(val1, val2, 1)) {
                    return 0;
                }
            }
        }

        if (log) {
            LOGVAL(LYE_DUPLIST, LY_VLOG_LYD, second, second->schema->name);
        }
        return 1;
    default:
        LOGINT;
        return -1;
    }
}